

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteGraph.cpp
# Opt level: O0

bool __thiscall dg::dda::RWNode::isDynAlloc(RWNode *this)

{
  bool bVar1;
  RWNodeType RVar2;
  reference this_00;
  RWNode *in_RDI;
  RWNode *val;
  RWCalledValue *cv;
  const_iterator __end3;
  const_iterator __begin3;
  CalleesT *__range3;
  RWNodeCall *C;
  RWNode *in_stack_ffffffffffffffc0;
  __normal_iterator<const_dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
  local_28;
  CalleesT *local_20;
  RWNodeCall *local_18;
  bool local_1;
  
  RVar2 = getType(in_RDI);
  if (RVar2 == DYN_ALLOC) {
    local_1 = true;
  }
  else {
    local_18 = RWNodeCall::get(in_stack_ffffffffffffffc0);
    if (local_18 != (RWNodeCall *)0x0) {
      local_20 = RWNodeCall::getCallees(local_18);
      local_28._M_current =
           (RWCalledValue *)
           std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::begin
                     ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *)
                      in_RDI);
      std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::end
                ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *)in_RDI);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                                 *)in_stack_ffffffffffffffc0,
                                (__normal_iterator<const_dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                                 *)in_RDI), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<const_dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                  ::operator*(&local_28);
        in_stack_ffffffffffffffc0 = RWCalledValue::getCalledValue(this_00);
        if ((in_stack_ffffffffffffffc0 != (RWNode *)0x0) &&
           (RVar2 = getType(in_stack_ffffffffffffffc0), RVar2 == DYN_ALLOC)) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<const_dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
        ::operator++(&local_28);
      }
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RWNode::isDynAlloc() const {
    if (getType() == RWNodeType::DYN_ALLOC)
        return true;

    if (const auto *C = RWNodeCall::get(this)) {
        for (const auto &cv : C->getCallees()) {
            if (const auto *val = cv.getCalledValue()) {
                if (val->getType() == RWNodeType::DYN_ALLOC) {
                    return true;
                }
            }
        }
    }

    return false;
}